

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O0

int __thiscall
GF2::MP<6ul,GF2::MOGrlex<6ul>>::CompareNC<GF2::MOLex<6ul>>
          (MP<6UL,_GF2::MOGrlex<6UL>_> *this,MP<6UL,_GF2::MOLex<6UL>_> *polyRight)

{
  int iVar1;
  MP<6UL,_GF2::MOGrlex<6UL>_> *in_RDI;
  MP<6UL,_GF2::MOGrlex<6UL>_> *unaff_retaddr;
  MP<6UL,_GF2::MOGrlex<6UL>_> *in_stack_00000008;
  MP<6UL,_GF2::MOGrlex<6UL>_> poly;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  MP<6UL,_GF2::MOGrlex<6UL>_> *in_stack_ffffffffffffffc0;
  MP<6UL,_GF2::MOLex<6UL>_> local_30;
  
  MP<GF2::MOLex<6ul>>(in_stack_ffffffffffffffc0,&local_30);
  MP<6UL,_GF2::MOGrlex<6UL>_>::SetOrder
            (in_RDI,(MOGrlex<6UL> *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  iVar1 = MP<6UL,_GF2::MOGrlex<6UL>_>::Compare(in_stack_00000008,unaff_retaddr);
  MP<6UL,_GF2::MOGrlex<6UL>_>::~MP((MP<6UL,_GF2::MOGrlex<6UL>_> *)0x1b9310);
  return iVar1;
}

Assistant:

int CompareNC(const MP<_n, _O1>& polyRight) const
	{
		// меняем порядок
		MP poly(polyRight);
		poly.SetOrder(_order);
		// сравниваем
		return Compare(poly);
	}